

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

CHAR_DATA * new_char(void)

{
  CHAR_DATA *__s;
  long lVar1;
  
  if (char_free == (CHAR_DATA *)0x0) {
    __s = (CHAR_DATA *)operator_new(0x340);
  }
  else {
    __s = char_free;
    char_free = char_free->next;
  }
  memset(__s,0,0x340);
  __s->valid = true;
  __s->name = str_empty;
  __s->short_descr = str_empty;
  __s->long_descr = str_empty;
  __s->description = str_empty;
  __s->prompt = str_empty;
  __s->prefix = str_empty;
  __s->logon = current_time;
  __s->lines = 0x14;
  for (lVar1 = 0x105; lVar1 != 0x109; lVar1 = lVar1 + 1) {
    *(undefined2 *)((long)&__s->next + lVar1 * 2) = 0;
  }
  __s->position = 8;
  __s->hit = 0x14;
  __s->max_hit = 0x14;
  __s->mana = 100;
  __s->max_mana = 100;
  __s->move = 100;
  __s->max_move = 100;
  __s->arms = 2;
  __s->legs = 2;
  __s->balance = 0;
  __s->batter = 0;
  __s->regen_rate = 0;
  __s->analyze = 0;
  __s->talismanic = 0.0;
  __s->law_pass = false;
  zero_vector(__s->imm_flags);
  for (lVar1 = 0x134; lVar1 != 0x139; lVar1 = lVar1 + 1) {
    *(undefined2 *)((long)&__s->next + lVar1 * 2) = 0xd;
    *(undefined2 *)((long)&__s->next_in_room + lVar1 * 2 + 2) = 0;
  }
  return __s;
}

Assistant:

CHAR_DATA *new_char(void)
{
	static CHAR_DATA ch_zero;
	CHAR_DATA *ch;
	int i;

	if (char_free == nullptr)
	{
		ch = new CHAR_DATA;

		// if (bDebug)
		// 	RS.Logger.Debug("Char free is null.  . . . . !");
	}
	else
	{
		ch = char_free;
		char_free = char_free->next;
	}

	*ch = ch_zero;

	ch->valid = true;

	ch->name = &str_empty[0];
	ch->short_descr = &str_empty[0];
	ch->long_descr = &str_empty[0];
	ch->description = &str_empty[0];
	ch->prompt = &str_empty[0];
	ch->prefix = &str_empty[0];
	ch->logon = current_time;
	ch->played = 0;
	ch->lines = PAGELEN;

	for (i = 0; i < 4; i++)
	{
		ch->armor[i] = 0;
	}

	ch->position = POS_STANDING;
	ch->hit = 20;
	ch->max_hit = 20;
	ch->mana = 100;
	ch->max_mana = 100;
	ch->move = 100;
	ch->max_move = 100;
	ch->arms = 2;
	ch->legs = 2;
	ch->regen_rate = 0;
	ch->balance = 0;
	ch->batter = 0;
	ch->analyze = 0;
	ch->talismanic = 0;
	ch->law_pass= false;

	zero_vector(ch->imm_flags);

	for (i = 0; i < MAX_STATS; i++)
	{
		ch->perm_stat[i] = 13;
		ch->mod_stat[i] = 0;
	}

	return ch;
}